

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O2

int bit_tohex(lua_State *L)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  lua_Integer lVar4;
  char *pcVar5;
  ulong uVar6;
  size_t len;
  uint uVar7;
  char cStack_21;
  char buf [8];
  
  uVar3 = luaL_checkinteger(L,1);
  iVar1 = lua_type(L,2);
  if (iVar1 == -1) {
    pcVar5 = "0123456789abcdef";
    uVar2 = 8;
  }
  else {
    lVar4 = luaL_checkinteger(L,2);
    uVar2 = (uint)lVar4;
    pcVar5 = "0123456789abcdef";
    if ((int)uVar2 < 0) {
      pcVar5 = "0123456789ABCDEF";
    }
  }
  uVar7 = -uVar2;
  if (0 < (int)uVar2) {
    uVar7 = uVar2;
  }
  uVar6 = (ulong)uVar7;
  if (7 < (int)uVar7) {
    uVar6 = 8;
  }
  for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
    uVar7 = (uint)uVar3;
    uVar3 = (ulong)(uVar7 >> 4);
    buf[uVar6 - 1] = pcVar5[uVar7 & 0xf];
  }
  uVar7 = -uVar2;
  if (0 < (int)uVar2) {
    uVar7 = uVar2;
  }
  len = 8;
  if (uVar7 < 8) {
    len = (size_t)uVar7;
  }
  lua_pushlstring(L,buf,len);
  return 1;
}

Assistant:

static int bit_tohex(lua_State *L)
{
  UBits b = barg(L, 1);
  SBits n = lua_isnone(L, 2) ? 8 : (SBits)barg(L, 2);
  const char *hexdigits = "0123456789abcdef";
  char buf[8];
  int i;
  if (n < 0) { n = -n; hexdigits = "0123456789ABCDEF"; }
  if (n > 8) n = 8;
  for (i = (int)n; --i >= 0; ) { buf[i] = hexdigits[b & 15]; b >>= 4; }
  lua_pushlstring(L, buf, (size_t)n);
  return 1;
}